

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3Runner.hpp
# Opt level: O2

void * __thiscall Centaurus::Stage3Runner::acquire_bank(Stage3Runner *this)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  pvVar2 = (this->super_BaseRunner).m_sub_window;
  lVar3 = 0;
  do {
    do {
      lVar4 = lVar3;
      lVar3 = 0;
    } while ((this->super_BaseRunner).m_bank_num <= lVar4);
    if (*(int *)((long)pvVar2 + lVar4 * 8 + 4) == 4) {
      iVar1 = *(int *)((long)pvVar2 + lVar4 * 8);
      if (iVar1 == this->m_counter) {
        LOCK();
        *(undefined4 *)((long)pvVar2 + lVar4 * 8 + 4) = 5;
        UNLOCK();
        if (this->m_xferlistener != (TransferListener)0x0) {
          (*this->m_xferlistener)((int)lVar4,iVar1,this->m_listener_context);
        }
        this->m_current_bank = (int)lVar4;
        this->m_counter = this->m_counter + 1;
        return (void *)(lVar4 * (this->super_BaseRunner).m_bank_size +
                       (long)(this->super_BaseRunner).m_main_window);
      }
    }
    else if (*(int *)((long)pvVar2 + lVar4 * 8 + 4) == 6) {
      return (void *)0x0;
    }
    lVar3 = lVar4 + 1;
  } while( true );
}

Assistant:

void *acquire_bank()
  {
    WindowBankEntry *banks = reinterpret_cast<WindowBankEntry *>(m_sub_window);
    while (true) {
      for (int i = 0; i < m_bank_num; i++) {
        if (banks[i].state == WindowBankState::Stage2_Unlocked) {
          if (banks[i].number == m_counter) {
            banks[i].state = WindowBankState::Stage3_Locked;

            if (m_xferlistener != nullptr)
              m_xferlistener(i, banks[i].number, m_listener_context);

            //std::cout << "Bank " << banks[i].number << " reached Stage3" << std::endl;

            m_current_bank = i;
            m_counter++;
            return (char *)m_main_window + m_bank_size * i;
          }
        } else if (banks[i].state == WindowBankState::YouAreDone) {
          return NULL;
        }
      }
    }
  }